

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O2

int __thiscall TPZPostProcAnalysis::ClassId(TPZPostProcAnalysis *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZPostProcAnalysis",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZLinearAnalysis::ClassId(&this->super_TPZLinearAnalysis);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZPostProcAnalysis::ClassId() const{
    return Hash("TPZPostProcAnalysis") ^ TPZLinearAnalysis::ClassId() << 1;
}